

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp15.c
# Opt level: O0

void G15_(PDISASM pMyDisasm)

{
  int iVar1;
  Int32 IVar2;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).REGOPCODE =
         (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
    if ((pMyDisasm->Reserved_).PrefRepe == 1) {
      if ((pMyDisasm->Reserved_).REGOPCODE == 0) {
        if ((pMyDisasm->Reserved_).Architecture == 0x40) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            (pMyDisasm->Instruction).Category = 0x1a0000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"rdfsbase");
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Reserved_).OperandSize = IVar2;
            decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Operand2).OpType = 0x20000;
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Operand2).OpSize = IVar2;
            (pMyDisasm->Operand2).Registers.type = 0x800;
            (pMyDisasm->Operand2).Registers.segment = 0x10;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 1) {
        if ((pMyDisasm->Reserved_).Architecture == 0x40) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            (pMyDisasm->Instruction).Category = 0x1a0000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"rdgsbase");
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Reserved_).OperandSize = IVar2;
            decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
            (pMyDisasm->Operand2).OpType = 0x20000;
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Operand2).OpSize = IVar2;
            (pMyDisasm->Operand2).Registers.type = 0x800;
            (pMyDisasm->Operand2).Registers.segment = 0x20;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 2) {
        if ((pMyDisasm->Reserved_).Architecture == 0x40) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            (pMyDisasm->Instruction).Category = 0x1a0000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"wrfsbase");
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Reserved_).OperandSize = IVar2;
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Operand1).OpType = 0x20000;
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Operand1).OpSize = IVar2;
            (pMyDisasm->Operand1).Registers.type = 0x800;
            (pMyDisasm->Operand1).Registers.segment = 0x10;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 3) {
        if ((pMyDisasm->Reserved_).Architecture == 0x40) {
          (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
          if ((pMyDisasm->Reserved_).MOD_ == 3) {
            (pMyDisasm->Instruction).Category = 0x1a0000;
            strcpy((pMyDisasm->Instruction).Mnemonic,"wrgsbase");
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Reserved_).OperandSize = IVar2;
            decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
            (pMyDisasm->Operand1).OpType = 0x20000;
            IVar2 = 0x20;
            if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
              IVar2 = 0x40;
            }
            (pMyDisasm->Operand1).OpSize = IVar2;
            (pMyDisasm->Operand1).Registers.type = 0x800;
            (pMyDisasm->Operand1).Registers.segment = 0x20;
          }
          else {
            failDecode(pMyDisasm);
          }
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 4) {
        if ((pMyDisasm->Prefix).OperandSize == '\x01') {
          (pMyDisasm->Reserved_).ERROR_OPCODE = 2;
        }
        (pMyDisasm->Instruction).Category = 0x10000;
        strcpy((pMyDisasm->Instruction).Mnemonic,"ptwrite");
        IVar2 = 3;
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          IVar2 = 4;
        }
        (pMyDisasm->Reserved_).MemDecoration = IVar2;
        IVar2 = 0x20;
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          IVar2 = 0x40;
        }
        (pMyDisasm->Reserved_).OperandSize = IVar2;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Operand1).AccessMode = 1;
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 5) {
        (pMyDisasm->Instruction).Category = 0x170000;
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          if (((pMyDisasm->Reserved_).REX.state == '\x01') &&
             ((pMyDisasm->Reserved_).REX.W_ == '\x01')) {
            strcpy((pMyDisasm->Instruction).Mnemonic,"incsspq");
          }
          else {
            strcpy((pMyDisasm->Instruction).Mnemonic,"incsspd");
          }
          IVar2 = 0x20;
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            IVar2 = 0x40;
          }
          (pMyDisasm->Reserved_).OperandSize = IVar2;
          decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          (pMyDisasm->Operand1).OpType = 0x20000;
          (pMyDisasm->Operand1).OpSize = 0x40;
          (pMyDisasm->Operand1).Registers.type = 0x20;
          (pMyDisasm->Operand1).Registers.special = 4;
        }
        else {
          failDecode(pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      if ((pMyDisasm->Reserved_).REGOPCODE == 6) {
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Instruction).Category = 0x1b0000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"clwb");
          (pMyDisasm->Reserved_).MemDecoration = 1;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 7) {
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Instruction).Category = 0x1c0000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"clflushopt");
          (pMyDisasm->Reserved_).MemDecoration = 1;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        }
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      if ((pMyDisasm->Reserved_).REGOPCODE == 0) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 5;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Instruction).Category = 0x1d0000;
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            strcpy((pMyDisasm->Instruction).Mnemonic,"fxsave64");
          }
          else {
            strcpy((pMyDisasm->Instruction).Mnemonic,"fxsave");
          }
          (pMyDisasm->Operand1).OpSize = 0x1000;
          (pMyDisasm->Instruction).ImplicitUsedRegs.type = 0x1006;
          (pMyDisasm->Instruction).ImplicitUsedRegs.fpu = 0xff;
          (pMyDisasm->Instruction).ImplicitUsedRegs.mmx = 0xff;
          (pMyDisasm->Instruction).ImplicitUsedRegs.xmm = 0xff;
          (pMyDisasm->Instruction).ImplicitUsedRegs.special = 2;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 1) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 5;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Instruction).Category = 0x1d0000;
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            strcpy((pMyDisasm->Instruction).Mnemonic,"fxrstor64");
          }
          else {
            strcpy((pMyDisasm->Instruction).Mnemonic,"fxrstor");
          }
          (pMyDisasm->Operand1).OpSize = 0x1000;
          (pMyDisasm->Operand1).AccessMode = 1;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 0x1006;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.fpu = 0xff;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.mmx = 0xff;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.xmm = 0xff;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.special = 2;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 2) {
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        if (((pMyDisasm->Reserved_).VEX.state == '\x01') && ((pMyDisasm->Reserved_).VEX.L != '\0'))
        {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 0x67;
          decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
            (pMyDisasm->Instruction).Category = 0x110013;
            strcpy((pMyDisasm->Instruction).Mnemonic,"vldmxcsr");
          }
          else {
            (pMyDisasm->Instruction).Category = 0x40013;
            strcpy((pMyDisasm->Instruction).Mnemonic,"ldmxcsr");
          }
          (pMyDisasm->Operand1).OpType = 0x20000;
          (pMyDisasm->Operand1).Registers.type = 0x20;
          (pMyDisasm->Operand1).Registers.special = 2;
          (pMyDisasm->Operand1).OpSize = 0x20;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 3) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 3;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
            (pMyDisasm->Instruction).Category = 0x110013;
            strcpy((pMyDisasm->Instruction).Mnemonic,"vstmxcsr");
          }
          else {
            (pMyDisasm->Instruction).Category = 0x40013;
            strcpy((pMyDisasm->Instruction).Mnemonic,"stmxcsr");
          }
          (pMyDisasm->Operand2).OpType = 0x20000;
          (pMyDisasm->Operand2).Registers.type = 0x20;
          (pMyDisasm->Operand1).Registers.special = 2;
          (pMyDisasm->Operand2).OpSize = 0x20;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 4) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          failDecode(pMyDisasm);
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 5;
          (pMyDisasm->Instruction).Category = 0x1e0000;
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            strcpy((pMyDisasm->Instruction).Mnemonic,"xsave64");
          }
          else {
            strcpy((pMyDisasm->Instruction).Mnemonic,"xsave");
          }
          (pMyDisasm->Operand1).OpSize = 0x1000;
          (pMyDisasm->Operand1).AccessMode = 2;
          (pMyDisasm->Instruction).ImplicitUsedRegs.type = 1;
          (pMyDisasm->Instruction).ImplicitUsedRegs.gpr = 5;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 5) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          (pMyDisasm->Instruction).Category = 0x50019;
          strcpy((pMyDisasm->Instruction).Mnemonic,"lfence");
        }
        else {
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Reserved_).MemDecoration = 5;
          (pMyDisasm->Instruction).Category = 0x1e0000;
          strcpy((pMyDisasm->Instruction).Mnemonic,"xrstor");
          (pMyDisasm->Operand1).OpSize = 0x1000;
          (pMyDisasm->Operand1).AccessMode = 1;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
          (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 6) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          (pMyDisasm->Instruction).Category = 0x50019;
          strcpy((pMyDisasm->Instruction).Mnemonic,"mfence");
        }
        else {
          (pMyDisasm->Instruction).Category = 0x190000;
          if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
            strcpy((pMyDisasm->Instruction).Mnemonic,"xsaveopt64");
          }
          else {
            strcpy((pMyDisasm->Instruction).Mnemonic,"xsaveopt");
          }
          (pMyDisasm->Reserved_).MemDecoration = 5;
          decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
          (pMyDisasm->Operand1).OpSize = 0x1000;
          (pMyDisasm->Operand2).OpType = 0x20000;
          (pMyDisasm->Operand2).Registers.type = 1;
          (pMyDisasm->Operand2).Registers.gpr = 5;
        }
      }
      else if ((pMyDisasm->Reserved_).REGOPCODE == 7) {
        if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
          failDecode(pMyDisasm);
          return;
        }
        (pMyDisasm->Reserved_).MOD_ = (int)(uint)*(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 6;
        if ((pMyDisasm->Reserved_).MOD_ == 3) {
          (pMyDisasm->Instruction).Category = 0x50019;
          strcpy((pMyDisasm->Instruction).Mnemonic,"sfence");
        }
        else {
          (pMyDisasm->Reserved_).OperandSize = 8;
          decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
          (pMyDisasm->Reserved_).OperandSize = 0x20;
          (pMyDisasm->Reserved_).MemDecoration = 0x65;
          (pMyDisasm->Instruction).Category = 0x50019;
          strcpy((pMyDisasm->Instruction).Mnemonic,"clflush");
        }
      }
      else {
        failDecode(pMyDisasm);
      }
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ G15_(PDISASM pMyDisasm)
{
  if (!Security(2, pMyDisasm)) return;
  GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
  /* ========= 0xf3 */
  if (GV.PrefRepe == 1) {
    if (GV.REGOPCODE == 0) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdfsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand2.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand2.Registers.segment = REG4;
    }
    else if (GV.REGOPCODE == 1) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "rdgsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand2.OpType = REGISTER_TYPE;
      pMyDisasm->Operand2.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand2.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand2.Registers.segment = REG5;
    }
    else if (GV.REGOPCODE == 2) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "wrfsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand1.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand1.Registers.segment = REG4;
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.Architecture != 64) { failDecode(pMyDisasm); return; }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      pMyDisasm->Instruction.Category = FSGSBASE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "wrgsbase");
      #endif
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = (GV.REX.W_ == 1) ? 64 : 32;
      pMyDisasm->Operand1.Registers.type = SEGMENT_REG;
      pMyDisasm->Operand1.Registers.segment = REG5;
    }
    else if (GV.REGOPCODE == 4) {
      if (pMyDisasm->Prefix.OperandSize == InUsePrefix) GV.ERROR_OPCODE = UD_;
      pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ptwrite");
      #endif
      GV.MemDecoration = (GV.REX.W_ == 1) ? Arg1qword : Arg1dword;
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      pMyDisasm->Operand1.AccessMode = READ;
    }
    else if (GV.REGOPCODE == 5) {
      pMyDisasm->Instruction.Category = CET_INSTRUCTION;
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) { failDecode(pMyDisasm); return; }
      if ((GV.REX.state == InUsePrefix) && (GV.REX.W_ == 1)) {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "incsspq");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "incsspd");
        #endif
      }
      GV.OperandSize = (GV.REX.W_ == 1) ? 64 : 32;
      decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.OpSize = 64;
      pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
      pMyDisasm->Operand1.Registers.special = REG2; /* SSP reg */
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  /* ========= 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    if (GV.REGOPCODE == 6) {
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        pMyDisasm->Instruction.Category = CLWB_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clwb");
        #endif
        GV.MemDecoration = Arg1byte;

        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      }
      else  {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 7) {
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        pMyDisasm->Instruction.Category = CLFLUSHOPT_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clflushopt");
        #endif
        GV.MemDecoration = Arg1byte;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    if (GV.REGOPCODE == 0) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_ != 0x3) {
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Instruction.Category = FXSR_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxsave64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxsave");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Instruction.ImplicitUsedRegs.type = FPU_REG + SSE_REG + MMX_REG;
        pMyDisasm->Instruction.ImplicitUsedRegs.fpu = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.mmx = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.xmm = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitUsedRegs.special = REG1; /* MXCSR Register */
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 1) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Instruction.Category = FXSR_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxrstor64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "fxrstor");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = FPU_REG + SSE_REG + MMX_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.fpu = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.mmx = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.xmm = REG0+REG1+REG2+REG3+REG4+REG5+REG6+REG7;
        pMyDisasm->Instruction.ImplicitModifiedRegs.special = REG1; /* MXCSR Register */

      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 2) {
      if (GV.EVEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      if ((GV.VEX.state == InUsePrefix) && (GV.VEX.L != 0)) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg2dword;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        if (GV.VEX.state == InUsePrefix) {
          pMyDisasm->Instruction.Category = AVX_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vldmxcsr");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = SSE_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "ldmxcsr");
          #endif
        }
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = SPECIAL_REG;
        pMyDisasm->Operand1.Registers.special = REG1;
        pMyDisasm->Operand1.OpSize = 32;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 3) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1dword;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        if (GV.VEX.state == InUsePrefix) {
          pMyDisasm->Instruction.Category = AVX_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vstmxcsr");
          #endif
        }
        else {
          pMyDisasm->Instruction.Category = SSE_INSTRUCTION+STATE_MANAGEMENT;
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "stmxcsr");
          #endif
        }
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type = SPECIAL_REG;
        pMyDisasm->Operand1.Registers.special = REG1;
        pMyDisasm->Operand2.OpSize = 32;
      }
      else {
        failDecode(pMyDisasm);
      }
    }
    else if (GV.REGOPCODE == 4) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      if (GV.MOD_!= 0x3) {
        GV.MemDecoration = Arg1multibytes;
        pMyDisasm->Instruction.Category = XSAVE_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsave64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsave");
          #endif
        }
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = WRITE;
        pMyDisasm->Instruction.ImplicitUsedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitUsedRegs.gpr = REG0 + REG2;
      }
      else {
        failDecode(pMyDisasm);
      }
    }

    else if (GV.REGOPCODE == 5) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "lfence");
        #endif
      }
      else {
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        GV.MemDecoration = Arg1multibytes;
        pMyDisasm->Instruction.Category = XSAVE_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xrstor");
        #endif
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand1.AccessMode = READ;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0 | REG2;
      }
    }
    else if (GV.REGOPCODE == 6) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mfence");
        #endif
      }
      else {
        pMyDisasm->Instruction.Category = XSAVEOPT_INSTRUCTION;
        if (GV.REX.W_ == 1) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsaveopt64");
          #endif
        }
        else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) strcpy (pMyDisasm->Instruction.Mnemonic, "xsaveopt");
          #endif
        }
        GV.MemDecoration = Arg1multibytes;
        decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
        pMyDisasm->Operand1.OpSize = 512 * 8;
        pMyDisasm->Operand2.OpType = REGISTER_TYPE;
        pMyDisasm->Operand2.Registers.type =  GENERAL_REG;
        pMyDisasm->Operand2.Registers.gpr = REG0 + REG2;
      }
    }
    else if (GV.REGOPCODE == 7) {
      if (GV.VEX.state == InUsePrefix) {
        failDecode(pMyDisasm);
        return;
      }
      GV.MOD_= ((*((UInt8*) (GV.EIP_+1))) >> 6) & 0x3;
      if (GV.MOD_== 0x3) {
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "sfence");
        #endif
      }
      else {
        GV.OperandSize = 8;
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.OperandSize = 32;
        GV.MemDecoration = Arg2byte;
        pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+CACHEABILITY_CONTROL;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "clflush");
        #endif
      }
    }
    else {
      failDecode(pMyDisasm);
    }
    GV.EIP_+= GV.DECALAGE_EIP+2;
  }
}